

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall MeCab::FeatureIndex::openTemplate(FeatureIndex *this,Param *param)

{
  pointer ppcVar1;
  char *__s1;
  int iVar2;
  ostream *poVar3;
  long *plVar4;
  size_t sVar5;
  allocator local_311;
  scoped_fixed_array<char,_8192> buf;
  char *column [4];
  string local_2b8;
  string filename;
  string local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream ifs;
  byte abStack_218 [488];
  
  Param::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,param,
             "dicdir");
  std::__cxx11::string::string((string *)column,"feature.def",(allocator *)&local_2b8);
  create_filename(&filename,(string *)&ifs,(string *)column);
  std::__cxx11::string::~string((string *)column);
  std::__cxx11::string::~string((string *)&ifs);
  std::ifstream::ifstream(&ifs,filename._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(_ifs + -0x18)] & 5) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x51);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"ifs");
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3,"no such file or directory: ");
    std::operator<<(poVar3,(string *)&filename);
    die::~die((die *)column);
  }
  buf._vptr_scoped_fixed_array = (_func_int **)&PTR__scoped_fixed_array_0019ed28;
  buf.ptr_ = (char *)operator_new__(0x2000);
  buf.size_ = 0x2000;
  ppcVar1 = (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppcVar1) {
    (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  ppcVar1 = (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
      .super__Vector_impl_data._M_finish != ppcVar1) {
    (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppcVar1;
  }
  while (plVar4 = (long *)std::istream::getline((char *)&ifs,(long)buf.ptr_),
        (*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
    if ((0x23 < (ulong)(byte)*buf.ptr_) ||
       ((0x900000001U >> ((ulong)(byte)*buf.ptr_ & 0x3f) & 1) == 0)) {
      sVar5 = tokenize2<char**>(buf.ptr_,"\t ",column,2);
      if (sVar5 != 2) {
        poVar3 = std::operator<<((ostream *)&std::cerr,
                                 "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                );
        poVar3 = std::operator<<(poVar3,"(");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x5d);
        poVar3 = std::operator<<(poVar3,") [");
        poVar3 = std::operator<<(poVar3,"tokenize2(buf.get(), \"\\t \", column, 2) == 2");
        poVar3 = std::operator<<(poVar3,"] ");
        poVar3 = std::operator<<(poVar3,"format error: ");
        std::operator<<(poVar3,(string *)&filename);
        die::~die((die *)&local_2b8);
      }
      __s1 = column[0];
      iVar2 = strcmp(column[0],"UNIGRAM");
      if (iVar2 == 0) {
        local_2b8._M_dataplus._M_p = strdup(this,column[1]);
        std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                  ((vector<char_const*,std::allocator<char_const*>> *)&this->unigram_templs_,
                   (char **)&local_2b8);
      }
      else {
        iVar2 = strcmp(__s1,"BIGRAM");
        if (iVar2 == 0) {
          local_2b8._M_dataplus._M_p = strdup(this,column[1]);
          std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                    ((vector<char_const*,std::allocator<char_const*>> *)&this->bigram_templs_,
                     (char **)&local_2b8);
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,"(");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x65);
          poVar3 = std::operator<<(poVar3,") [");
          poVar3 = std::operator<<(poVar3,"false");
          poVar3 = std::operator<<(poVar3,"] ");
          poVar3 = std::operator<<(poVar3,"format error: ");
          std::operator<<(poVar3,(string *)&filename);
          die::~die((die *)&local_2b8);
        }
      }
    }
  }
  Param::get<std::__cxx11::string>(&local_258,param,"dicdir");
  std::__cxx11::string::string((string *)&local_278,"rewrite.def",&local_311);
  create_filename(&local_2b8,&local_258,&local_278);
  std::__cxx11::string::operator=((string *)&filename,(string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_258);
  DictionaryRewriter::open(&this->rewrite_,filename._M_dataplus._M_p,0);
  scoped_fixed_array<char,_8192>::~scoped_fixed_array(&buf);
  std::ifstream::~ifstream(&ifs);
  std::__cxx11::string::~string((string *)&filename);
  return true;
}

Assistant:

bool FeatureIndex::openTemplate(const Param &param) {
  std::string filename = create_filename(param.get<std::string>("dicdir"),
                                         FEATURE_FILE);
  std::ifstream ifs(WPATH(filename.c_str()));
  CHECK_DIE(ifs) << "no such file or directory: " << filename;

  scoped_fixed_array<char, BUF_SIZE> buf;
  char *column[4];

  unigram_templs_.clear();
  bigram_templs_.clear();

  while (ifs.getline(buf.get(), buf.size())) {
    if (buf[0] == '\0' || buf[0] == '#' || buf[0] == ' ') {
      continue;
    }
    CHECK_DIE(tokenize2(buf.get(), "\t ", column, 2) == 2)
        << "format error: " <<filename;

    if (std::strcmp(column[0], "UNIGRAM") == 0) {
      unigram_templs_.push_back(this->strdup(column[1]));
    } else if (std::strcmp(column[0], "BIGRAM") == 0) {
      bigram_templs_.push_back(this->strdup(column[1]));
    } else {
      CHECK_DIE(false) << "format error: " <<  filename;
    }
  }

  // second, open rewrite rules
  filename = create_filename(param.get<std::string>("dicdir"),
                             REWRITE_FILE);
  rewrite_.open(filename.c_str());

  return true;
}